

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_shared_expressions.cpp
# Opt level: O2

void duckdb::WindowSharedExpressions::PrepareExecutors
               (Shared *shared,ExpressionExecutor *exec,DataChunk *chunk)

{
  Expression *pEVar1;
  Allocator *allocator;
  pointer poVar2;
  vector<duckdb::LogicalType,_true> types;
  optional_ptr<const_duckdb::Expression,_true> expr;
  vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> sorted;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_68;
  optional_ptr<const_duckdb::Expression,_true> local_50;
  _Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
  local_48;
  
  GetSortedExpressions
            ((vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *)&local_48,shared)
  ;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (poVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
      poVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; poVar2 = poVar2 + 1) {
    local_50.ptr = poVar2->ptr;
    pEVar1 = optional_ptr<const_duckdb::Expression,_true>::operator*(&local_50);
    ExpressionExecutor::AddExpression(exec,pEVar1);
    pEVar1 = optional_ptr<const_duckdb::Expression,_true>::operator->(&local_50);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&local_68,
               &pEVar1->return_type);
  }
  if (local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    allocator = ExpressionExecutor::GetAllocator(exec);
    DataChunk::Initialize(chunk,allocator,(vector<duckdb::LogicalType,_true> *)&local_68,0x800);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_68);
  ::std::
  _Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
  ::~_Vector_base(&local_48);
  return;
}

Assistant:

void WindowSharedExpressions::PrepareExecutors(Shared &shared, ExpressionExecutor &exec, DataChunk &chunk) {
	const auto sorted = GetSortedExpressions(shared);
	vector<LogicalType> types;
	for (auto expr : sorted) {
		exec.AddExpression(*expr);
		types.emplace_back(expr->return_type);
	}

	if (!types.empty()) {
		chunk.Initialize(exec.GetAllocator(), types);
	}
}